

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall
Diligent::GLContextState::SetFrontFace(GLContextState *this,bool FrontCounterClockwise)

{
  bool bVar1;
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  GLenum err;
  GLenum FrontFace;
  bool FrontCounterClockwise_local;
  GLContextState *this_local;
  
  bVar1 = EnableStateHelper::operator!=
                    (&(this->m_RSState).FrontCounterClockwise,FrontCounterClockwise);
  if (bVar1) {
    glFrontFace();
    msg.field_2._12_4_ = glGetError();
    if (msg.field_2._12_4_ != 0) {
      LogError<false,char[25],char[17],unsigned_int>
                (false,"SetFrontFace",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x27a,(char (*) [25])"Failed to set front face",(char (*) [17])"\nGL Error Code: "
                 ,(uint *)(msg.field_2._M_local_buf + 0xc));
      FormatString<char[6]>((string *)local_40,(char (*) [6])0x4585f6);
      Message = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (Message,"SetFrontFace",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x27a);
      std::__cxx11::string::~string((string *)local_40);
    }
    EnableStateHelper::operator=(&(this->m_RSState).FrontCounterClockwise,FrontCounterClockwise);
  }
  return;
}

Assistant:

void GLContextState::SetFrontFace(bool FrontCounterClockwise)
{
    if (m_RSState.FrontCounterClockwise != FrontCounterClockwise)
    {
        GLenum FrontFace = FrontCounterClockwise ? GL_CCW : GL_CW;
        glFrontFace(FrontFace);
        DEV_CHECK_GL_ERROR("Failed to set front face");
        m_RSState.FrontCounterClockwise = FrontCounterClockwise;
    }
}